

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

void dump_buffer_e(huff_entropy_ptr_conflict entropy)

{
  jpeg_destination_mgr *pjVar1;
  j_compress_ptr pjVar2;
  jpeg_error_mgr *pjVar3;
  boolean bVar4;
  
  pjVar1 = entropy->cinfo->dest;
  bVar4 = (*pjVar1->empty_output_buffer)(entropy->cinfo);
  if (bVar4 == 0) {
    pjVar2 = entropy->cinfo;
    pjVar3 = pjVar2->err;
    pjVar3->msg_code = 0x19;
    (*pjVar3->error_exit)((j_common_ptr)pjVar2);
  }
  entropy->next_output_byte = pjVar1->next_output_byte;
  entropy->free_in_buffer = pjVar1->free_in_buffer;
  return;
}

Assistant:

LOCAL(void)
dump_buffer_e (huff_entropy_ptr entropy)
/* Empty the output buffer; we do not support suspension in this case. */
{
  struct jpeg_destination_mgr * dest = entropy->cinfo->dest;

  if (! (*dest->empty_output_buffer) (entropy->cinfo))
    ERREXIT(entropy->cinfo, JERR_CANT_SUSPEND);
  /* After a successful buffer dump, must reset buffer pointers */
  entropy->next_output_byte = dest->next_output_byte;
  entropy->free_in_buffer = dest->free_in_buffer;
}